

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_unit_ops.cpp
# Opt level: O3

void __thiscall unitOps_rootPow1_Test::~unitOps_rootPow1_Test(unitOps_rootPow1_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(unitOps, rootPow1)
{
    EXPECT_EQ(root(count, 1), count);
    EXPECT_EQ(root(cd, 1), cd);
    EXPECT_EQ(root(mol, 1), mol);
    EXPECT_EQ(root(currency, 1), currency);

    EXPECT_EQ(root(count, -1), count.inv());
    EXPECT_EQ(root(cd, -1), cd.inv());
    EXPECT_EQ(root(mol, -1), mol.inv());
    EXPECT_EQ(root(currency, -1), currency.inv());
}